

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_kernel_1.cpp
# Opt level: O3

void __thiscall dlib::logger::logger_stream::print_header_and_stuff(logger_stream *this)

{
  logger *plVar1;
  print_header_type p_Var2;
  log_level *plVar3;
  uint64 uVar4;
  
  if (this->been_used == false) {
    rmutex::lock(&this->log->gd->m,1);
    plVar1 = this->log;
    if (*(long *)((long)(plVar1->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.data + 8) == 0)
    {
      p_Var2 = plVar1->print_header;
      plVar3 = this->l;
      uVar4 = global_data::get_thread_name(plVar1->gd);
      (*p_Var2)(&plVar1->out,&plVar1->logger_name,plVar3,uVar4);
    }
    else {
      std::vector<char,_std::allocator<char>_>::resize(&(plVar1->gd->hookbuf).buffer,0);
    }
    this->been_used = true;
  }
  return;
}

Assistant:

void logger::logger_stream::
    print_header_and_stuff (
    )
    {
        if (!been_used)
        {
            log.gd.m.lock();

            // Check if the output hook is setup.  If it isn't then we print the logger
            // header like normal.  Otherwise we need to remember to clear out the output
            // stringstream we always write to.
            if (log.hook.is_set() == false)
            {
                log.logger_header()(log.out,log.name(),l,log.gd.get_thread_name());
            }
            else
            {
                // Make sure the hook buffer doesn't have any old data in it before we start
                // logging a new message into it.
                log.gd.hookbuf.buffer.resize(0);
            }
            been_used = true;
        }
    }